

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedString::GenerateAccessorDeclarations
          (RepeatedString *this,Printer *p)

{
  bool bVar1;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_98;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  FeatureSet *local_28;
  DescriptorNames local_20;
  
  bVar1 = protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors
                    ((this->super_FieldGeneratorBase).field_);
  if (bVar1) {
    io::Printer::Emit(p,0x3c,"\n      private:  // Hidden due to unknown ctype option.\n    ");
  }
  v3.storage_.callback_buffer_[8] = '\n';
  v3.storage_.callback_buffer_[9] = '\0';
  v3.storage_.callback_buffer_[10] = '\0';
  v3.storage_.callback_buffer_[0xb] = '\0';
  v3.storage_.callback_buffer_[0xc] = '\0';
  v3.storage_.callback_buffer_[0xd] = '\0';
  v3.storage_.callback_buffer_[0xe] = '\0';
  v3.storage_.callback_buffer_[0xf] = '\0';
  v3.storage_.is_callback_engaged_ = false;
  v3.storage_._1_7_ = 0;
  v3.storage_.callback_buffer_._0_8_ = (long)anon_var_dwarf_651463 + 5;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&v2,(cpp *)(this->super_FieldGeneratorBase).field_,(FieldDescriptor *)&v3,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(2),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = (long)(v2.storage_.callback_buffer_._0_8_ - v2.storage_._0_8_) / 0xb8;
  vars.ptr_ = (pointer)v2.storage_._0_8_;
  io::Printer::WithVars(&v1,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&v2);
  v3.storage_.callback_buffer_[8] = '\x04';
  v3.storage_.callback_buffer_[9] = '\0';
  v3.storage_.callback_buffer_[10] = '\0';
  v3.storage_.callback_buffer_[0xb] = '\0';
  v3.storage_.callback_buffer_[0xc] = '\0';
  v3.storage_.callback_buffer_[0xd] = '\0';
  v3.storage_.callback_buffer_[0xe] = '\0';
  v3.storage_.callback_buffer_[0xf] = '\0';
  v3.storage_.is_callback_engaged_ = true;
  v3.storage_._1_7_ = 0;
  v3.storage_.callback_buffer_._0_8_ = (long)"feature_set_" + 8;
  prefixes.len_ = (size_type)&DAT_100000001;
  prefixes.ptr_ = (pointer)0x2;
  AnnotatedAccessors(&local_98,(cpp *)(this->super_FieldGeneratorBase).field_,(FieldDescriptor *)&v3
                     ,prefixes,(optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9)
  ;
  vars_00.len_ = ((long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
  vars_00.ptr_ = local_98.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithVars(&v2,p,vars_00);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_98);
  local_28 = (FeatureSet *)&DAT_00000008;
  local_20.payload_ = "mutable_";
  prefixes_00.len_ = (size_type)&DAT_100000002;
  prefixes_00.ptr_ = (pointer)0x1;
  AnnotatedAccessors(&local_98,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_28,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_01.len_ = ((long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
  vars_01.ptr_ = local_98.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithVars(&v3,p,vars_01);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_98);
  io::Printer::Emit(p,0x32f,
                    "\n    $DEPRECATED$ const ::std::string& $name$(int index) const;\n    $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$(int index);\n    template <typename Arg_ = const ::std::string&, typename... Args_>\n    $DEPRECATED$ void set_$name$(int index, Arg_&& value, Args_... args);\n    $DEPRECATED$ ::std::string* $nonnull$ $add_name$();\n    template <typename Arg_ = const ::std::string&, typename... Args_>\n    $DEPRECATED$ void $add_name$(Arg_&& value, Args_... args);\n    $DEPRECATED$ const $pb$::RepeatedPtrField<::std::string>& $name$() const;\n    $DEPRECATED$ $pb$::RepeatedPtrField<::std::string>* $nonnull$ $mutable_name$();\n\n    private:\n    const $pb$::RepeatedPtrField<::std::string>& _internal_$name$() const;\n    $pb$::RepeatedPtrField<::std::string>* $nonnull$ _internal_mutable_$name$();\n\n    public:\n  "
                   );
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v3);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v2);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v1);
  return;
}

Assistant:

void RepeatedString::GenerateAccessorDeclarations(io::Printer* p) const {
  if (internal::cpp::IsStringFieldWithPrivatizedAccessors(*field_)) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto v1 = p->WithVars(AnnotatedAccessors(field_, {"", "_internal_"}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_", "add_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit(R"cc(
    $DEPRECATED$ const ::std::string& $name$(int index) const;
    $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$(int index);
    template <typename Arg_ = const ::std::string&, typename... Args_>
    $DEPRECATED$ void set_$name$(int index, Arg_&& value, Args_... args);
    $DEPRECATED$ ::std::string* $nonnull$ $add_name$();
    template <typename Arg_ = const ::std::string&, typename... Args_>
    $DEPRECATED$ void $add_name$(Arg_&& value, Args_... args);
    $DEPRECATED$ const $pb$::RepeatedPtrField<::std::string>& $name$() const;
    $DEPRECATED$ $pb$::RepeatedPtrField<::std::string>* $nonnull$ $mutable_name$();

    private:
    const $pb$::RepeatedPtrField<::std::string>& _internal_$name$() const;
    $pb$::RepeatedPtrField<::std::string>* $nonnull$ _internal_mutable_$name$();

    public:
  )cc");
}